

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::CLUFactor<double>::vSolveRight4update2sparse
          (CLUFactor<double> *this,double eps,double *vec,int *idx,double *rhs,int *ridx,int *rn,
          double eps2,double *vec2,int *idx2,double *rhs2,int *ridx2,int *rn2,double *forest,
          int *forestNum,int *forestIdx)

{
  double dVar1;
  int *piVar2;
  CLUFactor<double> *this_00;
  int iVar3;
  double *pdVar4;
  long lVar5;
  int *piVar6;
  int *it;
  double dVar7;
  int local_94;
  double local_90;
  int *local_88;
  double *local_80;
  int *local_78;
  int *local_70;
  double local_68;
  double *local_60;
  int *local_58;
  CLUFactor<double> *local_50;
  double local_48;
  undefined8 uStack_40;
  
  local_90 = eps;
  local_88 = rn;
  local_80 = rhs;
  local_78 = ridx;
  local_68 = eps2;
  local_60 = vec;
  local_58 = idx;
  vSolveLright2(this,rhs,ridx,rn,eps,rhs2,ridx2,rn2,eps2);
  piVar2 = local_88;
  local_70 = (this->row).perm;
  local_94 = 0;
  pdVar4 = local_80;
  piVar6 = local_78;
  dVar7 = local_90;
  local_50 = this;
  if (forest == (double *)0x0) {
    forestNum = local_88;
    for (lVar5 = 0; lVar5 < *forestNum; lVar5 = lVar5 + 1) {
      iVar3 = piVar6[lVar5];
      if (ABS(pdVar4[iVar3]) <= dVar7) {
        pdVar4[iVar3] = 0.0;
      }
      else {
        enQueueMax(piVar6,&local_94,local_70[iVar3]);
        pdVar4 = local_80;
        forestNum = local_88;
        piVar6 = local_78;
        dVar7 = local_90;
      }
    }
  }
  else {
    for (lVar5 = 0; lVar5 < *piVar2; lVar5 = lVar5 + 1) {
      iVar3 = piVar6[lVar5];
      dVar1 = pdVar4[iVar3];
      if (ABS(dVar1) <= dVar7) {
        pdVar4[iVar3] = 0.0;
      }
      else {
        *forestIdx = iVar3;
        forestIdx = forestIdx + 1;
        uStack_40 = 0;
        local_48 = dVar1;
        enQueueMax(piVar6,&local_94,local_70[iVar3]);
        forest[iVar3] = local_48;
        pdVar4 = local_80;
        piVar6 = local_78;
        dVar7 = local_90;
      }
    }
    *piVar2 = local_94;
  }
  *forestNum = local_94;
  local_94 = 0;
  for (lVar5 = 0; this_00 = local_50, piVar2 = local_88, lVar5 < *rn2; lVar5 = lVar5 + 1) {
    iVar3 = ridx2[lVar5];
    if (ABS(rhs2[iVar3]) <= local_68) {
      rhs2[iVar3] = 0.0;
    }
    else {
      enQueueMax(ridx2,&local_94,local_70[iVar3]);
      pdVar4 = local_80;
      piVar6 = local_78;
      dVar7 = local_90;
    }
  }
  *rn2 = local_94;
  iVar3 = vSolveUright(local_50,local_60,local_58,pdVar4,piVar6,*local_88,dVar7);
  *piVar2 = iVar3;
  iVar3 = vSolveUright(this_00,vec2,idx2,rhs2,ridx2,*rn2,local_68);
  piVar2 = local_88;
  *rn2 = iVar3;
  if ((this_00->l).updateType == 0) {
    iVar3 = vSolveUpdateRight(this_00,local_60,local_58,*local_88,local_90);
    *piVar2 = iVar3;
    iVar3 = vSolveUpdateRight(this_00,vec2,idx2,*rn2,local_68);
    *rn2 = iVar3;
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveRight4update2sparse(R eps, R* vec, int* idx,         /* result1 */
      R* rhs, int* ridx, int& rn,        /* rhs1    */
      R eps2, R* vec2, int* idx2,     /* result2 */
      R* rhs2, int* ridx2, int& rn2,     /* rhs2    */
      R* forest, int* forestNum, int* forestIdx)
{
   /* solve with L */
   vSolveLright2(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);

   R x;
   int i, j, k;
   int* rperm = row.perm;

   /*  turn index list into a heap for both ridx and ridx2 */
   if(forest)
   {
      int* it = forestIdx;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   for(i = j = 0; i < rn2; ++i)
   {
      k = ridx2[i];
      assert(k >= 0 && k < thedim);
      x = rhs2[k];

      if(isNotZero(x, eps2))
         enQueueMax(ridx2, &j, rperm[k]);
      else
         rhs2[k] = 0;
   }

   rn2 = j;

   /* solve with U */
   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);
   rn2 = vSolveUright(vec2, idx2, rhs2, ridx2, rn2, eps2);

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      rn2 = vSolveUpdateRight(vec2, idx2, rn2, eps2);
   }
}